

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void ptls_log_init_conn_state(ptls_log_conn_state_t *state,_func_void_void_ptr_size_t *random_bytes)

{
  undefined8 uVar1;
  uint32_t r;
  uint local_28;
  uint uStack_24;
  
  (*random_bytes)(&local_28,4);
  state->random_ = (float)local_28 * 2.3283064e-10;
  uVar1 = _EVP_aes_128_ecb;
  *(undefined8 *)&(state->address).__in6_u = _in6addr_any;
  *(undefined8 *)((long)&(state->address).__in6_u + 8) = uVar1;
  *(ulong *)&state->field_0x14 = (ulong)uStack_24;
  *(undefined8 *)&(state->state).field_0x4 = 0;
  *(undefined4 *)((long)&(state->state).generation + 4) = 0;
  return;
}

Assistant:

void ptls_log_init_conn_state(ptls_log_conn_state_t *state, void (*random_bytes)(void *, size_t))
{
    uint32_t r;
    random_bytes(&r, sizeof(r));

    *state = (ptls_log_conn_state_t){
        .random_ = (float)r / ((uint64_t)UINT32_MAX + 1), /* [0..1), so that any(r) < sample_ratio where sample_ratio is [0..1] */
        .address = in6addr_any,
    };
}